

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

void __thiscall
ctemplate::SnippetEscape::Modify
          (SnippetEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte *__s1;
  byte bVar1;
  bool bVar2;
  int iVar3;
  _func_int **pp_Var4;
  uint uVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lStack_50;
  UnclosedSnippetTags unclosed;
  
  unclosed.tag_length = 0;
  unclosed.tags[0] = '\0';
  unclosed.tags[1] = '\0';
  unclosed.tags[2] = '\0';
  unclosed.tags[3] = '\0';
  unclosed.tags[4] = '\0';
  pbVar8 = (byte *)(in + inlen);
  pbVar7 = (byte *)in;
  do {
    while( true ) {
      if (pbVar8 <= in) {
        if (pbVar7 < in) {
          (*out->_vptr_ExpandEmitter[5])(out,pbVar7,(long)in - (long)pbVar7);
        }
        UnclosedSnippetTags::PrintClosingTags(&unclosed,out);
        return;
      }
      bVar1 = *in;
      if (bVar1 == 0x3c) break;
      if (bVar1 - 9 < 5) {
        if (pbVar7 < in) {
          (*out->_vptr_ExpandEmitter[5])(out,pbVar7,(long)in - (long)pbVar7);
        }
        pp_Var4 = out->_vptr_ExpandEmitter;
        pcVar6 = " ";
LAB_0012e5bb:
        lStack_50 = 1;
      }
      else {
        if (bVar1 != 0x22) {
          if (bVar1 == 0x26) {
            if (pbVar7 < in) {
              (*out->_vptr_ExpandEmitter[5])(out,pbVar7,(long)in - (long)pbVar7);
            }
            if ((pbVar8 <= (byte *)in + 1) || (((byte *)in)[1] != 0x7b)) {
              pp_Var4 = out->_vptr_ExpandEmitter;
              pcVar6 = "&";
              goto LAB_0012e5bb;
            }
            pp_Var4 = out->_vptr_ExpandEmitter;
            pcVar6 = "&amp;";
LAB_0012e6ab:
            lStack_50 = 5;
            goto LAB_0012e6ad;
          }
          if (bVar1 == 0x27) {
            if (pbVar7 < in) {
              (*out->_vptr_ExpandEmitter[5])(out,pbVar7,(long)in - (long)pbVar7);
            }
            pp_Var4 = out->_vptr_ExpandEmitter;
            pcVar6 = "&#39;";
            goto LAB_0012e6ab;
          }
          lStack_50 = 1;
          if (bVar1 != 0x3e) goto LAB_0012e3dd;
          if (pbVar7 < in) {
            (*out->_vptr_ExpandEmitter[5])(out,pbVar7,(long)in - (long)pbVar7);
          }
          pp_Var4 = out->_vptr_ExpandEmitter;
          pcVar6 = "&gt;";
          goto LAB_0012e681;
        }
        if (pbVar7 < in) {
          (*out->_vptr_ExpandEmitter[5])(out,pbVar7,(long)in - (long)pbVar7);
        }
        pp_Var4 = out->_vptr_ExpandEmitter;
        pcVar6 = "&quot;";
        lStack_50 = 6;
      }
LAB_0012e6ad:
      (*pp_Var4[5])(out,pcVar6,lStack_50);
      in = (char *)((byte *)in + 1);
      pbVar7 = (byte *)in;
    }
    __s1 = (byte *)in + 1;
    uVar5 = (int)pbVar8 - (int)__s1;
    if ((int)uVar5 < 2) {
LAB_0012e56a:
      if (pbVar7 < in) {
        (*out->_vptr_ExpandEmitter[5])(out,pbVar7,(long)in - (long)pbVar7);
      }
      pp_Var4 = out->_vptr_ExpandEmitter;
      pcVar6 = "&lt;";
LAB_0012e681:
      lStack_50 = 4;
      goto LAB_0012e6ad;
    }
    lStack_50 = 3;
    if (((*(short *)__s1 != 0x3e62) ||
        (bVar2 = UnclosedSnippetTags::MaybeAdd(&unclosed,TAG_B), !bVar2)) &&
       ((*(short *)__s1 != 0x3e69 ||
        (bVar2 = UnclosedSnippetTags::MaybeAdd(&unclosed,TAG_I), !bVar2)))) {
      if (uVar5 != 2) {
        iVar3 = bcmp(__s1,"em>",3);
        if (iVar3 == 0) {
          bVar2 = UnclosedSnippetTags::MaybeAdd(&unclosed,TAG_EM);
          lStack_50 = 4;
          if (bVar2) goto LAB_0012e3dd;
        }
        if (((0xc < uVar5) && (iVar3 = bcmp(__s1,"span dir=",9), iVar3 == 0)) &&
           ((*(int *)((byte *)in + 10) == 0x3e72746c || (*(int *)((byte *)in + 10) == 0x3e6c7472))))
        {
          bVar2 = UnclosedSnippetTags::MaybeAdd(&unclosed,TAG_SPAN);
          lStack_50 = 0xe;
          if (bVar2) goto LAB_0012e3dd;
        }
        iVar3 = bcmp(__s1,"/b>",3);
        if (iVar3 == 0) {
          bVar2 = UnclosedSnippetTags::MaybeRemove(&unclosed,TAG_B);
          lStack_50 = 4;
          if (bVar2) goto LAB_0012e3dd;
        }
        iVar3 = bcmp(__s1,"/i>",3);
        if (iVar3 == 0) {
          bVar2 = UnclosedSnippetTags::MaybeRemove(&unclosed,TAG_I);
          lStack_50 = 4;
          if (bVar2) goto LAB_0012e3dd;
        }
        if (3 < uVar5) {
          if (*(int *)__s1 == 0x3e6d652f) {
            bVar2 = UnclosedSnippetTags::MaybeRemove(&unclosed,TAG_EM);
            lStack_50 = 5;
            if (bVar2) goto LAB_0012e3dd;
          }
          if ((5 < uVar5) && (iVar3 = bcmp(__s1,"/span>",6), iVar3 == 0)) {
            bVar2 = UnclosedSnippetTags::MaybeRemove(&unclosed,TAG_SPAN);
            lStack_50 = 7;
            if (bVar2) goto LAB_0012e3dd;
          }
        }
        iVar3 = bcmp(__s1,"br>",3);
        lStack_50 = 4;
        if ((iVar3 == 0) || ((3 < uVar5 && (lStack_50 = 5, *(int *)__s1 == 0x3e726277))))
        goto LAB_0012e3dd;
      }
      goto LAB_0012e56a;
    }
LAB_0012e3dd:
    in = (char *)((byte *)in + lStack_50);
  } while( true );
}

Assistant:

void SnippetEscape::Modify(const char* in, size_t inlen,
                           const PerExpandData*,
                           ExpandEmitter* out, const string& arg) const {
  UnclosedSnippetTags unclosed;
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '<': {
        // If there is a permissible tag, just advance pos past it to
        // make it part of the current run.  Notice the use of
        // "continue" below.
        const char* const next_pos = pos + 1;
        const int chars_left = limit - next_pos;
        if ((chars_left >= 2) && !memcmp(next_pos, "b>", 2)
            && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("<b>");
          continue;
        } else if ((chars_left >= 2) && !memcmp(next_pos, "i>", 2)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("<i>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "em>", 3)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("<em>");
          continue;
        } else if ((chars_left >= 13) && !memcmp(next_pos, "span dir=", 9)
                   && (!memcmp(next_pos + 9, "ltr>", 4) ||
                       !memcmp(next_pos + 9, "rtl>", 4))
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("<span dir=ltr>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/b>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("</b>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/i>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("</i>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "/em>", 4)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("</em>");
          continue;
        } else if ((chars_left >= 6) && !memcmp(next_pos, "/span>", 6)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("</span>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "br>", 3)) {
          pos += strliterallen("<br>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "wbr>", 4)) {
          pos += strliterallen("<wbr>");
          continue;
        }

        // Emit the entity and break out of the switch.
        EmitRun(start, pos, out);
        APPEND("&lt;");
        break;
      }

      case '&':
        EmitRun(start, pos, out);
        if (pos + 1 < limit && pos[1] == '{') {
          // Could be a javascript entity, so we need to escape.
          // (Javascript entities are an xss risk in Netscape 4.)
          APPEND("&amp;");
        } else {
          APPEND("&");
        }
        break;

      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;

      case '\r': case '\n': case '\v': case '\f': case '\t':
        // non-space whitespace
        EmitRun(start, pos, out); APPEND(" "); break;

    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
  unclosed.PrintClosingTags(out);
}